

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptorProto::SerializeWithCachedSizes
          (FieldDescriptorProto *this,CodedOutputStream *output)

{
  uint uVar1;
  string *psVar2;
  void *pvVar3;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.name");
    internal::WireFormatLite::WriteStringMaybeAliased(1,(this->name_).ptr_,output);
  }
  if ((uVar1 & 2) != 0) {
    psVar2 = (this->extendee_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.extendee");
    internal::WireFormatLite::WriteStringMaybeAliased(2,(this->extendee_).ptr_,output);
  }
  if ((uVar1 & 0x40) != 0) {
    internal::WireFormatLite::WriteInt32(3,this->number_,output);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    internal::WireFormatLite::WriteEnum(4,this->label_,output);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    internal::WireFormatLite::WriteEnum(5,this->type_,output);
  }
  if ((uVar1 & 4) != 0) {
    psVar2 = (this->type_name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.type_name");
    internal::WireFormatLite::WriteStringMaybeAliased(6,(this->type_name_).ptr_,output);
  }
  if ((uVar1 & 8) != 0) {
    psVar2 = (this->default_value_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.default_value");
    internal::WireFormatLite::WriteStringMaybeAliased(7,(this->default_value_).ptr_,output);
  }
  if ((uVar1 & 0x20) != 0) {
    internal::WireFormatLite::WriteMessageMaybeToArray(8,(MessageLite *)this->options_,output);
  }
  if ((char)uVar1 < '\0') {
    internal::WireFormatLite::WriteInt32(9,this->oneof_index_,output);
  }
  if ((uVar1 & 0x10) != 0) {
    psVar2 = (this->json_name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.json_name");
    internal::WireFormatLite::WriteStringMaybeAliased(10,(this->json_name_).ptr_,output);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    return;
  }
  internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void FieldDescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.FieldDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // optional string extendee = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->extendee().data(), this->extendee().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.extendee");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->extendee(), output);
  }

  // optional int32 number = 3;
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(3, this->number(), output);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      4, this->label(), output);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      5, this->type(), output);
  }

  // optional string type_name = 6;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type_name().data(), this->type_name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.type_name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      6, this->type_name(), output);
  }

  // optional string default_value = 7;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->default_value().data(), this->default_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.default_value");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      7, this->default_value(), output);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      8, *this->options_, output);
  }

  // optional int32 oneof_index = 9;
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(9, this->oneof_index(), output);
  }

  // optional string json_name = 10;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->json_name().data(), this->json_name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.json_name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      10, this->json_name(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.FieldDescriptorProto)
}